

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopDup(Kit_Sop_t *cResult,Kit_Sop_t *cSop,Vec_Int_t *vMemory)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  int local_28;
  uint local_24;
  int i;
  uint uCube;
  Vec_Int_t *vMemory_local;
  Kit_Sop_t *cSop_local;
  Kit_Sop_t *cResult_local;
  
  cResult->nCubes = 0;
  iVar1 = Kit_SopCubeNum(cSop);
  puVar2 = Vec_IntFetch(vMemory,iVar1);
  cResult->pCubes = puVar2;
  local_28 = 0;
  while( true ) {
    iVar1 = Kit_SopCubeNum(cSop);
    bVar3 = false;
    if (local_28 < iVar1) {
      local_24 = Kit_SopCube(cSop,local_28);
      bVar3 = local_24 != 0;
    }
    if (!bVar3) break;
    Kit_SopPushCube(cResult,local_24);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void Kit_SopDup( Kit_Sop_t * cResult, Kit_Sop_t * cSop, Vec_Int_t * vMemory )
{
    unsigned uCube;
    int i;
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    // add the cubes
    Kit_SopForEachCube( cSop, uCube, i )
        Kit_SopPushCube( cResult, uCube );
}